

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall
FIX::SocketInitiator::SocketInitiator
          (SocketInitiator *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings)

{
  _Rb_tree_header *p_Var1;
  
  Initiator::Initiator(&this->super_Initiator,application,factory,settings);
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__SocketInitiator_001fe570;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketInitiator_001fe5f0;
  SessionSettings::SessionSettings(&this->m_settings);
  HostDetailsProvider::HostDetailsProvider(&this->m_hostDetailsProvider);
  SocketConnector::SocketConnector(&this->m_connector,1);
  p_Var1 = &(this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_lastConnect = 0;
  this->m_reconnectInterval = 0x1e;
  this->m_noDelay = false;
  this->m_sendBufSize = 0;
  this->m_rcvBufSize = 0;
  return;
}

Assistant:

EXCEPT(ConfigError)
    : Initiator(application, factory, settings),
      m_connector(1),
      m_lastConnect(0),
      m_reconnectInterval(30),
      m_noDelay(false),
      m_sendBufSize(0),
      m_rcvBufSize(0) {}